

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_cmpxchgl_le_sparc64
                   (CPUArchState_conflict17 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  bool bVar3;
  uintptr_t unaff_retaddr;
  undefined4 local_38;
  uint32_t _old;
  uint32_t ret;
  uint32_t *haddr;
  TCGMemOpIdx oi_local;
  uint32_t newv_local;
  uint32_t cmpv_local;
  target_ulong addr_local;
  CPUArchState_conflict17 *env_local;
  
  puVar2 = (uint32_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  LOCK();
  uVar1 = *puVar2;
  bVar3 = cmpv == uVar1;
  if (bVar3) {
    *puVar2 = newv;
    uVar1 = cmpv;
  }
  UNLOCK();
  local_38 = cmpv;
  if (!bVar3) {
    local_38 = uVar1;
  }
  return local_38;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}